

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrF
          (X3DImporter *this,int pAttrIdx,vector<float,_std::allocator<float>_> *pValue)

{
  bool bVar1;
  int iVar2;
  pointer pFVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  size_t sVar5;
  back_insert_iterator<std::vector<float,_std::allocator<float>_>_> bVar6;
  WordIterator local_98;
  WordIterator local_88;
  undefined1 local_78 [8];
  WordIterator wordItEnd;
  WordIterator wordItBegin;
  char *val;
  shared_ptr<const_Assimp::FIValue> local_40;
  undefined1 local_30 [8];
  shared_ptr<const_Assimp::FIFloatValue> floatValue;
  vector<float,_std::allocator<float>_> *pValue_local;
  int pAttrIdx_local;
  X3DImporter *this_local;
  char *__s;
  
  floatValue.super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pValue;
  pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_40,pFVar3,(ulong)(uint)pAttrIdx);
  std::dynamic_pointer_cast<Assimp::FIFloatValue_const,Assimp::FIValue_const>
            ((shared_ptr<const_Assimp::FIValue> *)local_30);
  std::shared_ptr<const_Assimp::FIValue>::~shared_ptr(&local_40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    std::vector<float,_std::allocator<float>_>::operator=
              ((vector<float,_std::allocator<float>_> *)
               floatValue.super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi,&peVar4->value);
  }
  else {
    pFVar3 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar2 = (*(pFVar3->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar3,(ulong)(uint)pAttrIdx);
    __s = (char *)CONCAT44(extraout_var,iVar2);
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)
               floatValue.super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    sVar5 = strlen(__s);
    WordIterator::WordIterator((WordIterator *)&wordItEnd.end_,__s,__s + sVar5);
    WordIterator::WordIterator((WordIterator *)local_78);
    WordIterator::WordIterator(&local_88,(WordIterator *)&wordItEnd.end_);
    WordIterator::WordIterator(&local_98,(WordIterator *)local_78);
    bVar6 = std::back_inserter<std::vector<float,std::allocator<float>>>
                      ((vector<float,_std::allocator<float>_> *)
                       floatValue.
                       super___shared_ptr<const_Assimp::FIFloatValue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
    std::
    transform<Assimp::WordIterator,std::back_insert_iterator<std::vector<float,std::allocator<float>>>,Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrF(int,std::vector<float,std::allocator<float>>&)::__0>
              (&local_88,&local_98,bVar6.container);
  }
  std::shared_ptr<const_Assimp::FIFloatValue>::~shared_ptr
            ((shared_ptr<const_Assimp::FIFloatValue> *)local_30);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrF(const int pAttrIdx, std::vector<float>& pValue)
{
    auto floatValue = std::dynamic_pointer_cast<const FIFloatValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (floatValue) {
        pValue = floatValue->value;
    }
    else {
        const char *val = mReader->getAttributeValue(pAttrIdx);
        pValue.clear();

        //std::cregex_iterator wordItBegin(val, val + strlen(val), pattern_nws);
        //const std::cregex_iterator wordItEnd;
        //std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const std::cmatch &match) { return std::stof(match.str()); });

        WordIterator wordItBegin(val, val + strlen(val));
        WordIterator wordItEnd;
        std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const char *match) { return static_cast<float>(atof(match)); });
    }
}